

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::colPresolve(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  double dVar1;
  int iVar2;
  HighsLp *pHVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Result RVar8;
  HighsInt HVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  pHVar3 = this->model;
  dVar1 = (pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar15 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col] - dVar1;
  dVar16 = this->primal_feastol;
  if ((dVar15 <= dVar16) &&
     ((dVar15 <= (this->options->super_HighsOptionsStruct).small_matrix_value ||
      (dVar14 = getMaxAbsColVal(this,col), dVar14 * dVar15 <= dVar16)))) {
    if (dVar15 < -dVar16) {
      return kPrimalInfeasible;
    }
    local_50.nodeValue =
         (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_50.nodeIndex =
         (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_50.nodeNext =
         (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start;
    local_50.head =
         (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[col];
    HighsPostsolveStack::removedFixedCol<HighsTripletListSlice>
              (postsolve_stack,col,dVar1,
               (pHVar3->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col],&local_50);
    removeFixedCol(this,col);
    RVar8 = checkLimits(this,postsolve_stack);
    return RVar8;
  }
  iVar2 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if (iVar2 == 1) {
    RVar8 = singletonCol(this,postsolve_stack,col);
    return RVar8;
  }
  if (iVar2 == 0) {
    RVar8 = emptyCol(this,postsolve_stack,col);
    return RVar8;
  }
  RVar8 = detectDominatedCol(this,postsolve_stack,col,true);
  if (RVar8 != kOk) {
    return RVar8;
  }
  if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[col] != '\0') {
    return kOk;
  }
  bVar5 = isUpperImplied(this,col);
  bVar6 = isLowerImplied(this,col);
  if (this->mipsolver == (HighsMipSolver *)0x0) goto LAB_0030b3c4;
  if (bVar6) {
    iVar2 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    lVar13 = (long)iVar2;
    if ((((lVar13 != -1) &&
         ((this->impliedDualRowBounds).numInfSumUpperOrig.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [col] == 1)) &&
        (pHVar3 = this->model,
        0.0 <= (pHVar3->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col])) &&
       ((((pHVar3->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] <= -INFINITY ||
         (INFINITY <=
          (pHVar3->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13])) &&
        ((HVar9 = findNonzero(this,iVar2,col),
         (this->model->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
         ._M_impl.super__Vector_impl_data._M_start[col] != kInteger ||
         (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13] ==
           (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13] &&
          (bVar7 = rowCoefficientsIntegral
                             (this,iVar2,
                              1.0 / (this->Avalue).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[HVar9]), bVar7)))))))) {
      if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[HVar9] <= 0.0) {
        changeImplRowDualUpper(this,iVar2,0.0,col);
      }
      else {
        changeImplRowDualLower(this,iVar2,0.0,col);
      }
    }
  }
  if (bVar5) {
    iVar2 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    lVar13 = (long)iVar2;
    if (((((lVar13 != -1) &&
          ((this->impliedDualRowBounds).numInfSumLowerOrig.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           [col] == 1)) &&
         (pHVar3 = this->model,
         (pHVar3->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[col] <= 0.0)) &&
        (((pHVar3->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] <= -INFINITY ||
         (INFINITY <=
          (pHVar3->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13])))) &&
       ((HVar9 = findNonzero(this,iVar2,col),
        (this->model->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start[col] != kInteger ||
        (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] ==
          (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] &&
         (bVar7 = rowCoefficientsIntegral
                            (this,iVar2,
                             1.0 / (this->Avalue).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[HVar9]), bVar7)))))) {
      if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[HVar9] <= 0.0) {
        changeImplRowDualLower(this,iVar2,0.0,col);
      }
      else {
        changeImplRowDualUpper(this,iVar2,0.0,col);
      }
    }
  }
  convertImpliedInteger(this,col,-1,false);
  pHVar3 = this->model;
  if ((pHVar3->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
      .super__Vector_impl_data._M_start[col] != kContinuous) {
    dVar1 = (pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
        (dVar16 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[col], dVar1 != -INFINITY || dVar16 != INFINITY))
       && (0.5 < dVar16 - dVar1)) {
      if (ABS(dVar16) <= ABS(dVar1)) {
        if (ABS(dVar16) < 1000.5) {
          dVar15 = -1.0;
          goto LAB_0030b3ab;
        }
      }
      else if (ABS(dVar1) < 1000.5) {
        dVar15 = 1.0;
        dVar16 = dVar1;
LAB_0030b3ab:
        transformColumn(this,postsolve_stack,col,dVar15,dVar16);
      }
    }
  }
  if ((this->model->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start[col] == kInteger) {
    return kOk;
  }
LAB_0030b3c4:
  if ((!bVar6) ||
     (1 < (this->impliedDualRowBounds).numInfSumUpper.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[col])) {
    if (!bVar5) {
      return kOk;
    }
    if (1 < (this->impliedDualRowBounds).numInfSumLower.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [col]) {
      return kOk;
    }
  }
  piVar4 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  pdVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar13;
  pdVar12 = (double *)
            ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar13);
  if (lVar13 == -1) {
    pdVar11 = (double *)0x0;
    pdVar12 = (double *)0x0;
  }
  while ((int)lVar13 != -1) {
    updateRowDualImpliedBounds(this,*(HighsInt *)pdVar12,col,*pdVar11);
    lVar10 = (long)(int)lVar13;
    lVar13 = (long)piVar4[lVar10];
    pdVar12 = (double *)((long)pdVar12 + lVar13 * 4 + lVar10 * -4);
    pdVar11 = pdVar11 + (lVar13 - lVar10);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::colPresolve(HighsPostsolveStack& postsolve_stack,
                                         HighsInt col) {
  assert(!colDeleted[col]);
  const bool logging_on = analysis_.logging_on_;
  double boundDiff = model->col_upper_[col] - model->col_lower_[col];
  if (boundDiff <= primal_feastol) {
    if (boundDiff <= options->small_matrix_value ||
        getMaxAbsColVal(col) * boundDiff <= primal_feastol) {
      if (boundDiff < -primal_feastol) return Result::kPrimalInfeasible;
      postsolve_stack.removedFixedCol(col, model->col_lower_[col],
                                      model->col_cost_[col],
                                      getColumnVector(col));
      removeFixedCol(col);
      return checkLimits(postsolve_stack);
    }
  }

  switch (colsize[col]) {
    case 0:
      return emptyCol(postsolve_stack, col);
    case 1:
      return singletonCol(postsolve_stack, col);
    default:
      break;
  }

  // detect strong / weak domination
  HPRESOLVE_CHECKED_CALL(detectDominatedCol(postsolve_stack, col));
  if (colDeleted[col]) return Result::kOk;

  // column is not (weakly) dominated

  // the associated dual constraint has an upper bound if there is an infinite
  // or redundant column lower bound as then the reduced cost of the column must
  // not be positive i.e. <= 0
  bool dualConsHasUpper = isUpperImplied(col);
  bool dualConsHasLower = isLowerImplied(col);

  // integer columns cannot be used to tighten bounds on dual multipliers
  if (mipsolver != nullptr) {
    if (dualConsHasLower && colLowerSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumUpperOrig(col) == 1 &&
        model->col_cost_[col] >= 0) {
      HighsInt row = colLowerSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualLower(row, 0.0, col);
          else
            changeImplRowDualUpper(row, 0.0, col);
        }
      }
    }

    if (dualConsHasUpper && colUpperSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumLowerOrig(col) == 1 &&
        model->col_cost_[col] <= 0) {
      HighsInt row = colUpperSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualUpper(row, 0.0, col);
          else
            changeImplRowDualLower(row, 0.0, col);
        }
      }
    }

    convertImpliedInteger(col);

    // shift integral variables to have a lower bound of zero
    if (model->integrality_[col] != HighsVarType::kContinuous &&
        model->col_lower_[col] != 0.0 &&
        (model->col_lower_[col] != -kHighsInf ||
         model->col_upper_[col] != kHighsInf) &&
        model->col_upper_[col] - model->col_lower_[col] > 0.5) {
      // substitute with the bound that is smaller in magnitude and only
      // substitute if bound is not large for an integer
      if (std::abs(model->col_upper_[col]) > std::abs(model->col_lower_[col])) {
        if (std::abs(model->col_lower_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, 1.0, model->col_lower_[col]);
      } else {
        if (std::abs(model->col_upper_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, -1.0, model->col_upper_[col]);
      }
    }

    if (model->integrality_[col] == HighsVarType::kInteger) return Result::kOk;
  }

  // now check if we can expect to tighten at least one bound
  if ((dualConsHasLower && impliedDualRowBounds.getNumInfSumUpper(col) <= 1) ||
      (dualConsHasUpper && impliedDualRowBounds.getNumInfSumLower(col) <= 1)) {
    for (const HighsSliceNonzero& nonzero : getColumnVector(col))
      updateRowDualImpliedBounds(nonzero.index(), col, nonzero.value());
  }

  return Result::kOk;
}